

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdtr.c
# Opt level: O2

double hcephes_pdtrc(int k,double m)

{
  double dVar1;
  
  if ((-1 < k) && (0.0 < m)) {
    dVar1 = hcephes_igam((double)(k + 1),m);
    return dVar1;
  }
  hcephes_mtherr("pdtrc",1);
  return 0.0;
}

Assistant:

HCEPHES_API double hcephes_pdtrc(int k, double m) {
    double v;

    if ((k < 0) || (m <= 0.0)) {
        hcephes_mtherr("pdtrc", HCEPHES_DOMAIN);
        return (0.0);
    }
    v = k + 1;
    return (hcephes_igam(v, m));
}